

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_pavgb_mips64(uint64_t fs,uint64_t ft)

{
  uint local_2c;
  uint64_t uStack_28;
  uint i;
  LMIValue vt;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.d = fs;
  uStack_28 = ft;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    vt.ub[local_2c] =
         (uint8_t)((int)((uint)vt.ub[local_2c] +
                         (uint)*(byte *)((long)&stack0xffffffffffffffd8 + (ulong)local_2c) + 1) >> 1
                  );
  }
  return vt.d;
}

Assistant:

uint64_t helper_pavgb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; i++) {
        vs.ub[i] = (vs.ub[i] + vt.ub[i] + 1) >> 1;
    }
    return vs.d;
}